

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::AbstractDOMParser::createElementNS
          (AbstractDOMParser *this,XMLCh *namespaceURI,XMLCh *elemPrefix,XMLCh *localName,
          XMLCh *qName)

{
  DOMElementNSImpl *this_00;
  DOMDocument *local_48;
  XMLCh *qName_local;
  XMLCh *localName_local;
  XMLCh *elemPrefix_local;
  XMLCh *namespaceURI_local;
  AbstractDOMParser *this_local;
  
  this_00 = (DOMElementNSImpl *)operator_new(0xb0,this->fDocument,ELEMENT_NS_OBJECT);
  local_48 = (DOMDocument *)0x0;
  if (this->fDocument != (DOMDocumentImpl *)0x0) {
    local_48 = &this->fDocument->super_DOMDocument;
  }
  DOMElementNSImpl::DOMElementNSImpl(this_00,local_48,namespaceURI,elemPrefix,localName,qName);
  return (DOMElement *)this_00;
}

Assistant:

DOMElement* AbstractDOMParser::
createElementNS (const XMLCh* namespaceURI,
                 const XMLCh* elemPrefix,
                 const XMLCh* localName,
                 const XMLCh* qName)
{
  return new (fDocument, DOMMemoryManager::ELEMENT_NS_OBJECT)
    DOMElementNSImpl (fDocument,
                      namespaceURI,
                      elemPrefix,
                      localName,
                      qName);
}